

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
::HandleWaitingShaders
          (PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  pointer ppSVar1;
  bool bVar2;
  byte bVar3;
  SHADER_STATUS SVar4;
  char (*in_RCX) [33];
  pointer ppSVar5;
  bool bVar6;
  string msg;
  string local_50;
  
  if ((this->super_PipelineBuilderBase).m_State != WaitingShaders) {
    FormatString<char[26],char[33]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::WaitingShaders",in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"HandleWaitingShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  ppSVar5 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppSVar5 == ppSVar1;
  if (!bVar6) {
    bVar3 = 1;
    do {
      SVar4 = ShaderGLImpl::GetStatus(*ppSVar5,WaitForCompletion);
      if (SVar4 == SHADER_STATUS_FAILED) {
        (this->super_PipelineBuilderBase).m_State = Failed;
        bVar2 = false;
      }
      else {
        if (SVar4 != SHADER_STATUS_READY) {
          if (SVar4 == SHADER_STATUS_COMPILING) {
            bVar3 = 0;
          }
          else {
            FormatString<char[25]>(&local_50,(char (*) [25])"Unexpected shader status");
            DebugAssertionFailed
                      (local_50._M_dataplus._M_p,"HandleWaitingShaders",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                       ,0x16b);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
        bVar2 = true;
      }
      if (!bVar2) break;
      ppSVar5 = ppSVar5 + 1;
      bVar6 = ppSVar5 == ppSVar1;
    } while (!bVar6);
    bVar6 = (bool)(bVar6 & bVar3);
  }
  if (bVar6) {
    (this->super_PipelineBuilderBase).m_State = LinkingPrograms;
  }
  return;
}

Assistant:

void HandleWaitingShaders(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::WaitingShaders);
        bool AllShaderReady = true;
        for (ShaderGLImpl* pShaderGL : m_Shaders)
        {
            SHADER_STATUS Status = pShaderGL->GetStatus(WaitForCompletion);
            switch (Status)
            {
                case SHADER_STATUS_COMPILING:
                    AllShaderReady = false;
                    break;

                case SHADER_STATUS_FAILED:
                    m_State = State::Failed;
                    return;

                case SHADER_STATUS_READY:
                    break;

                default:
                    UNEXPECTED("Unexpected shader status");
            }
        }

        if (AllShaderReady)
        {
            m_State = State::LinkingPrograms;
        }
    }